

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPFakeTransmitter::ClearDestinations(RTPFakeTransmitter *this)

{
  if ((this->init == true) && (this->created == true)) {
    RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPFakeTrans_GetHashIndex_IPv4Dest,_8317>
    ::Clear(&this->destinations);
    return;
  }
  return;
}

Assistant:

void RTPFakeTransmitter::ClearDestinations()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
		destinations.Clear();
	MAINMUTEX_UNLOCK
}